

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

void __thiscall
cmFindLibraryHelper::cmFindLibraryHelper
          (cmFindLibraryHelper *this,string *debugName,cmMakefile *mf,cmFindBase *base)

{
  bool bVar1;
  cmGlobalGenerator *pcVar2;
  cmState *this_00;
  allocator<char> local_a9;
  string local_a8;
  string_view local_88;
  string_view local_78;
  string *local_68;
  string *suffixes_list;
  string *prefixes_list;
  cmFindBase *local_28;
  cmFindBase *base_local;
  cmMakefile *mf_local;
  string *debugName_local;
  cmFindLibraryHelper *this_local;
  
  this->Makefile = mf;
  this->FindBase = base;
  local_28 = base;
  base_local = (cmFindBase *)mf;
  mf_local = (cmMakefile *)debugName;
  debugName_local = (string *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Prefixes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Suffixes);
  std::__cxx11::string::string((string *)&this->PrefixRegexStr);
  std::__cxx11::string::string((string *)&this->SuffixRegexStr);
  std::__cxx11::string::string((string *)&this->BestPath);
  bVar1 = cmFindCommon::DebugModeEnabled(&local_28->super_cmFindCommon);
  this->DebugMode = bVar1;
  std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>::vector
            (&this->Names);
  std::__cxx11::string::string((string *)&this->TestPath);
  std::__cxx11::string::string((string *)&prefixes_list,(string *)debugName);
  cmFindBaseDebugState::cmFindBaseDebugState(&this->DebugSearches,(string *)&prefixes_list,local_28)
  ;
  std::__cxx11::string::~string((string *)&prefixes_list);
  pcVar2 = cmMakefile::GetGlobalGenerator(this->Makefile);
  this->GG = pcVar2;
  suffixes_list = (anonymous_namespace)::get_prefixes_abi_cxx11_(this->Makefile);
  local_68 = (anonymous_namespace)::get_suffixes_abi_cxx11_(this->Makefile);
  local_78 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)suffixes_list);
  cmExpandList(local_78,&this->Prefixes,true);
  local_88 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
  cmExpandList(local_88,&this->Suffixes,true);
  RegexFromList(this,&this->PrefixRegexStr,&this->Prefixes);
  RegexFromList(this,&this->SuffixRegexStr,&this->Suffixes);
  this_00 = cmMakefile::GetState(this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"FIND_LIBRARY_USE_OPENBSD_VERSIONING",&local_a9);
  bVar1 = cmState::GetGlobalPropertyAsBool(this_00,&local_a8);
  this->OpenBSD = bVar1;
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  return;
}

Assistant:

cmFindLibraryHelper::cmFindLibraryHelper(std::string debugName, cmMakefile* mf,
                                         cmFindBase const* base)
  : Makefile(mf)
  , FindBase(base)
  , DebugMode(base->DebugModeEnabled())
  , DebugSearches(std::move(debugName), base)
{
  this->GG = this->Makefile->GetGlobalGenerator();

  // Collect the list of library name prefixes/suffixes to try.
  std::string const& prefixes_list = get_prefixes(this->Makefile);
  std::string const& suffixes_list = get_suffixes(this->Makefile);

  cmExpandList(prefixes_list, this->Prefixes, true);
  cmExpandList(suffixes_list, this->Suffixes, true);
  this->RegexFromList(this->PrefixRegexStr, this->Prefixes);
  this->RegexFromList(this->SuffixRegexStr, this->Suffixes);

  // Check whether to use OpenBSD-style library version comparisons.
  this->OpenBSD = this->Makefile->GetState()->GetGlobalPropertyAsBool(
    "FIND_LIBRARY_USE_OPENBSD_VERSIONING");
}